

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

void __thiscall
tchecker::clock_constraints_visitor_t::visit
          (clock_constraints_visitor_t *this,typed_diagonal_clkconstr_expression_t *e)

{
  clock_id_t first;
  clock_id_t second;
  integer_t value;
  typed_lvalue_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  
  ptVar1 = typed_diagonal_clkconstr_expression_t::first_clock(e);
  first = clock_id(this,&ptVar1->super_typed_expression_t);
  ptVar1 = typed_diagonal_clkconstr_expression_t::second_clock(e);
  second = clock_id(this,&ptVar1->super_typed_expression_t);
  ptVar2 = typed_diagonal_clkconstr_expression_t::bound(e);
  value = const_evaluate((expression_t *)(&ptVar2->field_0x0 + *(long *)(*(long *)ptVar2 + -0x38)));
  add_constraints(this,first,second,
                  (e->super_typed_binary_expression_t).super_binary_expression_t._op,value);
  return;
}

Assistant:

virtual void visit(tchecker::typed_diagonal_clkconstr_expression_t const & e)
  {
    try {
      tchecker::clock_id_t first = clock_id(e.first_clock());
      tchecker::clock_id_t second = clock_id(e.second_clock());
      tchecker::integer_t value = tchecker::const_evaluate(e.bound());
      add_constraints(first, second, e.binary_operator(), value);
    }
    catch (...) {
      throw std::runtime_error("Syntax error in diagonal clock constraint: cannot compute clock IDs or constant");
    }
  }